

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

void cpu_instr_add_hl(gb_cpu_t *cpu,uint16_t value)

{
  uint uVar1;
  uint uVar2;
  undefined6 in_register_00000032;
  
  sync_with_cpu(cpu,4);
  uVar2 = (uint)CONCAT62(in_register_00000032,value);
  uVar1 = (cpu->field_3).reg_hl + uVar2;
  (cpu->field_0).field_0.reg_f =
       (0xffff < uVar1) << 4 | (cpu->field_0).field_0.reg_f & 0x8f |
       (0xfff < (uVar2 & 0xfff) + ((cpu->field_3).reg_hl & 0xfff)) << 5;
  (cpu->field_3).reg_hl = (uint16_t)uVar1;
  return;
}

Assistant:

static inline void cpu_instr_add_hl(gb_cpu_t *cpu, uint16_t value)
{
    sync_with_cpu(cpu, 4); // internal

    SET_N(0);
    SET_H(CHECK_CARRY_12((cpu->reg_hl & 0xFFF) + (value & 0xFFF)));
    SET_C(CHECK_CARRY_16(cpu->reg_hl + value));

    cpu->reg_hl += value;
}